

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Constraint *pAVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Slot local_138;
  Am_Slot local_130;
  Am_Slot local_128;
  Am_Slot local_120;
  Am_Slot local_118;
  Am_Slot local_110;
  Am_Slot local_108;
  Am_Slot local_100;
  Am_Formula local_f8;
  Am_Formula local_e8;
  Am_Formula local_d8;
  Am_Formula local_c8;
  Am_Formula local_b8;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Formula local_98;
  Am_Formula local_88;
  Am_Formula local_78;
  Am_Formula local_68;
  Am_Formula local_58;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object h_scroll;
  Am_Object local_18;
  Am_Object v_scroll;
  Am_Object_Advanced obj_adv;
  
  Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&v_scroll);
  Am_Object::Am_Object(&local_18);
  Am_Object::Am_Object(&local_30);
  Am_Object::Create(&local_38,(char *)&Am_Widget_Group);
  pAVar1 = Am_Object::Add(&local_38,0x11d,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x11e,0,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x96,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x96,0);
  pAVar1 = Am_Object::Add(pAVar1,0xcc,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x17d,true,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Add(pAVar1,0x6a,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar1 = Am_Object::Add(pAVar1,0x6b,pAVar2,0);
  pAVar1 = Am_Object::Add(pAVar1,400,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18a,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18b,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18c,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18d,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bb,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1bc,pAVar3,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bd,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1be,pAVar3,0);
  pAVar4 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_(&scrolling_group_draw);
  pAVar1 = Am_Object::Set(pAVar1,2000,pAVar4,0);
  pAVar4 = Am_Invalid_Method::operator_cast_to_Am_Method_Wrapper_(&scrolling_group_invalid);
  pAVar1 = Am_Object::Set(pAVar1,0x7d7,pAVar4,0);
  pAVar4 = Am_Translate_Coordinates_Method::operator_cast_to_Am_Method_Wrapper_
                     (&scroll_group_translate_coordinates);
  pAVar1 = Am_Object::Set(pAVar1,0x7dc,pAVar4,0);
  pAVar4 = Am_Point_In_Or_Self_Method::operator_cast_to_Am_Method_Wrapper_
                     (&scroll_group_point_in_part);
  pAVar1 = Am_Object::Set(pAVar1,0x7da,pAVar4,0);
  pAVar4 = Am_Point_In_Or_Self_Method::operator_cast_to_Am_Method_Wrapper_
                     (&scroll_group_point_in_leaf);
  pAVar1 = Am_Object::Set(pAVar1,0x7db,pAVar4,0);
  pAVar4 = Am_Point_In_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_point_in_obj);
  pAVar1 = Am_Object::Set(pAVar1,0x7d9,pAVar4,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18e,400,0);
  pAVar1 = Am_Object::Add(pAVar1,399,400,0);
  pAVar1 = Am_Object::Add(pAVar1,0xc5,-1,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Set_Old_Owner_To_Me);
  pAVar1 = Am_Object::Add(pAVar1,0x12d,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_left);
  pAVar1 = Am_Object::Add(pAVar1,0x1bf,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_top);
  pAVar1 = Am_Object::Add(pAVar1,0x1c0,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_width);
  pAVar1 = Am_Object::Add(pAVar1,0x1c1,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_height);
  pAVar1 = Am_Object::Add(pAVar1,0x1c2,pAVar3,0);
  Am_Object::Create(&local_48,(char *)&Am_Vertical_Scroll_Bar);
  pAVar5 = Am_Object::Set(&local_48,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_v_scroller_value_from_y_offset);
  pAVar5 = Am_Object::Add(pAVar5,0x8c,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_left);
  pAVar5 = Am_Object::Set(pAVar5,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_top);
  pAVar5 = Am_Object::Set(pAVar5,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_height);
  pAVar5 = Am_Object::Set(pAVar5,0x67,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_visible);
  pAVar5 = Am_Object::Set(pAVar5,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_active);
  pAVar5 = Am_Object::Set(pAVar5,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_58);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_58);
  pAVar5 = Am_Object::Set(pAVar5,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_68);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_68);
  pAVar5 = Am_Object::Set(pAVar5,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_78);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_78);
  pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar3,0);
  pAVar5 = Am_Object::Set(pAVar5,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_value_2);
  pAVar5 = Am_Object::Set(pAVar5,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_88);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
  pAVar5 = Am_Object::Set(pAVar5,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_98);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_98);
  pAVar5 = Am_Object::Set(pAVar5,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_percent_visible);
  pAVar5 = Am_Object::Set(pAVar5,0x185,pAVar3,0);
  pAVar5 = Am_Object::operator=(&local_18,pAVar5);
  Am_Object::Am_Object(&local_40,pAVar5);
  pAVar1 = Am_Object::Add_Part(pAVar1,0x1c4,&local_40,0);
  Am_Object::operator=(&Am_Scrolling_Group,pAVar1);
  Am_Object::~Am_Object(&local_40);
  Am_Formula::~Am_Formula(&local_98);
  Am_Formula::~Am_Formula(&local_88);
  Am_Formula::~Am_Formula(&local_78);
  Am_Formula::~Am_Formula(&local_68);
  Am_Formula::~Am_Formula(&local_58);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Create(&local_a8,(char *)&Am_Horizontal_Scroll_Bar);
  pAVar1 = Am_Object::Set(&local_a8,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_h_scroller_value_from_x_offset);
  pAVar1 = Am_Object::Add(pAVar1,0x8b,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_left);
  pAVar1 = Am_Object::Set(pAVar1,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_top);
  pAVar1 = Am_Object::Set(pAVar1,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_width);
  pAVar1 = Am_Object::Set(pAVar1,0x66,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_active);
  pAVar1 = Am_Object::Set(pAVar1,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_b8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_b8);
  pAVar1 = Am_Object::Set(pAVar1,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_c8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_c8);
  pAVar1 = Am_Object::Set(pAVar1,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_d8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_d8);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_value_2);
  pAVar1 = Am_Object::Set(pAVar1,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_e8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_e8);
  pAVar1 = Am_Object::Set(pAVar1,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_f8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_f8);
  pAVar1 = Am_Object::Set(pAVar1,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_percent_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x185,pAVar3,0);
  pAVar1 = Am_Object::operator=(&local_30,pAVar1);
  Am_Object::Am_Object(&local_a0,pAVar1);
  Am_Object::Add_Part(&Am_Scrolling_Group,0x1c3,&local_a0,0);
  Am_Object::~Am_Object(&local_a0);
  Am_Formula::~Am_Formula(&local_f8);
  Am_Formula::~Am_Formula(&local_e8);
  Am_Formula::~Am_Formula(&local_d8);
  Am_Formula::~Am_Formula(&local_c8);
  Am_Formula::~Am_Formula(&local_b8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object_Advanced::operator=
            ((Am_Object_Advanced *)&v_scroll,(Am_Object_Advanced *)&Am_Scrolling_Group);
  local_100 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x6b);
  Am_Slot::Set_Demon_Bits(&local_100,5);
  local_108 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x11d);
  Am_Slot::Set_Demon_Bits(&local_108,5);
  local_110 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x11e);
  Am_Slot::Set_Demon_Bits(&local_110,5);
  local_118 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18a);
  Am_Slot::Set_Demon_Bits(&local_118,5);
  local_120 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18b);
  Am_Slot::Set_Demon_Bits(&local_120,5);
  local_128 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18c);
  Am_Slot::Set_Demon_Bits(&local_128,5);
  local_130 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18d);
  Am_Slot::Set_Demon_Bits(&local_130,5);
  local_138 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,400);
  Am_Slot::Set_Demon_Bits(&local_138,5);
  Am_Object::Am_Object(&local_140,&Am_Scrolling_Group);
  remove_scrollers(&local_140);
  Am_Object::~Am_Object(&local_140);
  Am_Object::Get_Object(&local_148,(Am_Slot_Key)&local_18,0xc5);
  pAVar1 = Am_Object::Set(&local_148,0x150,"Scroll Vertical",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_do);
  pAVar1 = Am_Object::Set(pAVar1,0xca,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x147,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_selective_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x148,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_selective_repeat);
  pAVar1 = Am_Object::Set(pAVar1,0x149,pAVar4,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object(&local_148);
  Am_Object::Get_Object(&local_158,(Am_Slot_Key)&local_18,0x1ac);
  Am_Object::Get_Object(&local_150,(Am_Slot_Key)&local_158,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_inter_abort_do);
  Am_Object::Set(&local_150,0xc9,pAVar4,0);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_158);
  Am_Object::Get_Object(&local_160,(Am_Slot_Key)&local_30,0xc5);
  pAVar1 = Am_Object::Set(&local_160,0x150,"Scroll Horizontal",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_do);
  pAVar1 = Am_Object::Set(pAVar1,0xca,pAVar4,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x147,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_selective_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x148,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_selective_repeat);
  pAVar1 = Am_Object::Set(pAVar1,0x149,pAVar4,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object(&local_160);
  Am_Object::Get_Object(&local_170,(Am_Slot_Key)&local_30,0x1ac);
  Am_Object::Get_Object(&local_168,(Am_Slot_Key)&local_170,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_inter_abort_do);
  Am_Object::Set(&local_168,0xc9,pAVar4,0);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_18);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&v_scroll);
  return extraout_EAX;
}

Assistant:

static void
init()
{

  Am_Text_Edit_Internal_Command =
      Am_Command.Create(DSTR("Am_Edit_Text_Internal_Command"))
          .Set(Am_LABEL, "Edit_Text")
          .Set(Am_UNDO_METHOD, Am_Text_Command_Undo)
          .Set(Am_REDO_METHOD, Am_Text_Command_Undo) //works for both
          .Set(Am_SELECTIVE_UNDO_METHOD, Am_Text_Command_Selective_Undo)
          .Set(Am_SELECTIVE_REPEAT_SAME_METHOD, Am_Text_Command_Repeat_Same)
          .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_Text_Command_Repeat_New);

  Am_Text_Edit_Interactor =
      Am_Interactor.Create(DSTR("Am_Text_Interactor"))
          .Set(Am_INTER_START_METHOD, Am_Text_Start_Method)
          .Set(Am_INTER_ABORT_METHOD, Am_Text_Abort_Method)
          .Set(Am_INTER_OUTSIDE_METHOD, Am_Text_Outside_Method)
          // default outside stop method is fine
          .Set(Am_INTER_BACK_INSIDE_METHOD, Am_Text_Back_Inside_Method)
          .Set(Am_INTER_RUNNING_METHOD, Am_Text_Running_Method)
          .Set(Am_INTER_STOP_METHOD, Am_Text_Stop_Method)

          // no text_start_do needed
          .Set(Am_INTERIM_DO_METHOD, Am_Text_Interim_Do)
          .Set(Am_ABORT_DO_METHOD, Am_Text_Abort_Do)
          .Set(Am_DO_METHOD, Am_Text_Do)

          .Set(Am_START_WHERE_TEST, Am_Inter_In_Text_Object_Or_Part)
          .Set(Am_STOP_WHEN, Am_Input_Char("RETURN"))
          .Add(Am_TEXT_EDIT_METHOD, Am_Default_Text_Edit_Method)
          .Add(Am_EDIT_TRANSLATION_TABLE,
               Am_Edit_Translation_Table::Default_Table())
          .Add(Am_TEXT_CHECK_LEGAL_METHOD, 0)
          .Add(Am_WANT_PENDING_DELETE, false)
          .Add(Am_REAL_RUN_ALSO, 3)
          .Add_Part(Am_IMPLEMENTATION_COMMAND,
                    Am_Text_Edit_Internal_Command.Create(
                        DSTR("Text_Internal_Command")));
  Am_Text_Edit_Interactor.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Text_Edit")
      .Set_Name(DSTR("Am_Command_in_Text_Edit"));

  Am_Object Am_Text_Create_Internal_Command =
      Am_Object_Create_Command.Create(DSTR("Am_Text_Create_Internal_Command"))
          .Set(Am_LABEL, "Create Text")
          .Set(Am_UNDO_METHOD, Am_Text_Create_Command_Undo)
          .Set(Am_REDO_METHOD, Am_Text_Create_Command_Undo) //works for both
          .Set(Am_SELECTIVE_UNDO_METHOD, Am_Text_Create_Command_Selective_Undo)
          .Set(Am_SELECTIVE_REPEAT_SAME_METHOD,
               Am_Text_Create_Command_Repeat_Same)
          .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD,
               Am_Text_Create_Command_Repeat_New)
          .Add(Am_AS_LINE, false)
          .Add(Am_START_OBJECT, (0L));

  Am_Text_Create_Interactor =
      Am_Text_Edit_Interactor.Create(DSTR("Am_Text_Create_Interactor"))
          .Set(Am_START_WHERE_TEST, Am_Inter_Not_In_Text_Object_Or_Part)
          .Add(Am_CREATE_NEW_OBJECT_METHOD, (0L))
          .Add(Am_CREATE_IF_ZERO_LENGTH, false)
          .Add(Am_GRID_X, 0)
          .Add(Am_GRID_Y, 0)
          .Add(Am_GRID_ORIGIN_X, 0)
          .Add(Am_GRID_ORIGIN_Y, 0)
          .Add(Am_GRID_METHOD, 0)

          .Set(Am_START_DO_METHOD, Am_Text_Create_Start_Do)
          .Set(Am_ABORT_DO_METHOD, Am_Text_Create_Abort_Do)
          .Set(Am_DO_METHOD, Am_Text_Create_Do)
          //undo and redo just like creating
          .Set_Part(Am_IMPLEMENTATION_COMMAND,
                    Am_Text_Create_Internal_Command.Create(
                        DSTR("Text_Create_Internal_Command")))
          .Set_Part(
              Am_COMMAND,
              Am_Object_Create_Command.Create(DSTR("Am_Command_in_Text_Create"))
                  .Set(Am_LABEL, "Text_Create")
                  .Set(Am_SELECTIVE_REPEAT_SAME_ALLOWED, (0L))
                  .Set(Am_SELECTIVE_REPEAT_NEW_ALLOWED, (0L)));
}